

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

LY_ERR lyb_parse_schema_hash
                 (lyd_lyb_ctx *lybctx,lysc_node *sparent,lys_module *mod,lysc_node **snode)

{
  lylyb_ctx *lybctx_00;
  lysc_node *parent;
  ly_bool lVar1;
  LY_ERR LVar2;
  lysc_node *last;
  char *format;
  lysc_module *module;
  uint uVar3;
  uint32_t options;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint8_t hash [7];
  byte local_4f [7];
  lys_module *local_48;
  lysc_node *local_40;
  lysc_node **local_38;
  
  *snode = (lysc_node *)0x0;
  lybctx_00 = lybctx->lybctx;
  local_48 = mod;
  local_40 = sparent;
  lyb_read(local_4f,1,lybctx_00);
  if (local_4f[0] != 0) {
    if ((char)local_4f[0] < '\0') {
      uVar5 = 1;
    }
    else {
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        if ((int)uVar5 == 9) {
          ly_log(lybctx_00->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                 ,0x2df);
          return LY_EINT;
        }
        uVar6 = uVar5 + 1;
      } while (((uint)local_4f[0] << ((byte)uVar5 & 0x1f) & 0x40) == 0);
      local_38 = snode;
      local_4f[uVar5 + 1] = local_4f[0];
      uVar6 = uVar5 + 1 & 0xffffffff;
      do {
        uVar3 = ((uint)uVar6 & 0xff) - 1;
        lyb_read(local_4f + uVar3,1,lybctx_00);
        bVar7 = local_4f[uVar3];
        if (-1 < (char)(bVar7 << ((byte)uVar3 & 0x1f))) {
          __assert_fail("hash[j - 1] & (LYB_HASH_COLLISION_ID >> (j - 1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                        ,0x2eb,"LY_ERR lyb_read_hashes(struct lylyb_ctx *, uint8_t *, uint8_t *)");
        }
        if ((bVar7 >> (9U - (char)uVar6 & 0x1f) & 0x7f) != 0) {
          __assert_fail("!(hash[j - 1] & (LYB_HASH_MASK << (LYB_HASH_BITS - (j - 1))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                        ,0x2ed,"LY_ERR lyb_read_hashes(struct lylyb_ctx *, uint8_t *, uint8_t *)");
        }
        bVar7 = (char)uVar6 - 1;
        uVar6 = (ulong)bVar7;
      } while (bVar7 != 0);
      if (local_4f[0] == 0) {
        return LY_SUCCESS;
      }
      uVar5 = uVar5 + 2;
      snode = local_38;
    }
    options = (lybctx->int_opts & 4) << 2;
    last = (lysc_node *)0x0;
    parent = local_40;
    while( true ) {
      if ((parent == (lysc_node *)0x0) && (lybctx->ext != (lysc_ext_instance *)0x0)) {
        last = lys_getnext_ext(last,(lysc_node *)0x0,lybctx->ext,options);
      }
      else {
        if (local_48 == (lys_module *)0x0) {
          module = (lysc_module *)0x0;
        }
        else {
          module = local_48->compiled;
        }
        last = lys_getnext(last,parent,module,options);
      }
      if (last == (lysc_node *)0x0) break;
      if ((last->module->ctx != lybctx->lybctx->ctx) ||
         (lVar1 = lyb_has_schema_model(last,lybctx->lybctx->models), lVar1 != '\0')) {
        uVar6 = 0;
        while (bVar7 = lyb_get_hash(last,(uint8_t)uVar6), parent = local_40,
              bVar7 == local_4f[uVar6]) {
          uVar6 = uVar6 + 1;
          if ((uVar5 & 0xff) == uVar6) {
            LVar2 = lyd_parser_check_schema((lyd_ctx *)lybctx,last);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            goto LAB_00139be3;
          }
        }
      }
    }
    if (((ulong)lybctx->field_1 & 0x20000) != 0) {
      if (lybctx->ext == (lysc_ext_instance *)0x0) {
        if (local_48 == (lys_module *)0x0) {
          pcVar4 = parent->name;
          format = "Failed to find matching hash for a child node of \"%s\".";
        }
        else {
          pcVar4 = local_48->name;
          format = "Failed to find matching hash for a top-level node from \"%s\".";
        }
      }
      else {
        pcVar4 = lybctx->ext->def->name;
        format = "Failed to find matching hash for a node from \"%s\" extension instance node.";
      }
      ly_vlog(lybctx->lybctx->ctx,(char *)0x0,LYVE_REFERENCE,format,pcVar4);
      return LY_EVALID;
    }
LAB_00139be3:
    *snode = last;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyb_parse_schema_hash(struct lyd_lyb_ctx *lybctx, const struct lysc_node *sparent, const struct lys_module *mod,
        const struct lysc_node **snode)
{
    LY_ERR ret;
    const struct lysc_node *sibling;
    LYB_HASH hash[LYB_HASH_BITS - 1];
    uint32_t getnext_opts;
    uint8_t hash_count;

    *snode = NULL;

    ret = lyb_read_hashes(lybctx->lybctx, hash, &hash_count);
    LY_CHECK_RET(ret);

    if (!hash[0]) {
        /* opaque node */
        return LY_SUCCESS;
    }

    getnext_opts = lybctx->int_opts & LYD_INTOPT_REPLY ? LYS_GETNEXT_OUTPUT : 0;

    /* find our node with matching hashes */
    sibling = NULL;
    while (1) {
        if (!sparent && lybctx->ext) {
            sibling = lys_getnext_ext(sibling, sparent, lybctx->ext, getnext_opts);
        } else {
            sibling = lys_getnext(sibling, sparent, mod ? mod->compiled : NULL, getnext_opts);
        }
        if (!sibling) {
            break;
        }
        /* skip schema nodes from models not present during printing */
        if (((sibling->module->ctx != lybctx->lybctx->ctx) || lyb_has_schema_model(sibling, lybctx->lybctx->models)) &&
                lyb_is_schema_hash_match((struct lysc_node *)sibling, hash, hash_count)) {
            /* match found */
            break;
        }
    }

    if (!sibling && (lybctx->parse_opts & LYD_PARSE_STRICT)) {
        if (lybctx->ext) {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a node from \"%s\" extension instance node.",
                    lybctx->ext->def->name);
        } else if (mod) {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a top-level node"
                    " from \"%s\".", mod->name);
        } else {
            LOGVAL(lybctx->lybctx->ctx, LYVE_REFERENCE, "Failed to find matching hash for a child node"
                    " of \"%s\".", sparent->name);
        }
        return LY_EVALID;
    } else if (sibling && (ret = lyd_parser_check_schema((struct lyd_ctx *)lybctx, sibling))) {
        return ret;
    }

    *snode = sibling;
    return LY_SUCCESS;
}